

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
          (cmFileListGeneratorMacProject *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,char *ext)

{
  char *__s;
  allocator<char> local_21;
  char *local_20;
  char *ext_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  cmFileListGeneratorMacProject *this_local;
  
  local_20 = ext;
  ext_local = (char *)names;
  names_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this;
  cmFileListGeneratorBase::cmFileListGeneratorBase(&this->super_cmFileListGeneratorBase);
  __s = local_20;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorMacProject_00af4930;
  this->Names = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ext_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->Extension,__s,&local_21);
  std::allocator<char>::~allocator(&local_21);
  return;
}

Assistant:

cmFileListGeneratorMacProject(std::vector<std::string> const& names,
                                const char* ext)
    : Names(names)
    , Extension(ext)
  {
  }